

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

size_t lua_objlen(lua_State *L,int idx)

{
  ulong uVar1;
  uint uVar2;
  TValue *o;
  GCstr *pGVar3;
  ulong uVar4;
  
  o = index2adr(L,idx);
  uVar1 = o->u64;
  uVar4 = (long)uVar1 >> 0x2f;
  if (uVar4 == 0xfffffffffffffff3) {
    uVar2 = *(uint *)((uVar1 & 0x7fffffffffff) + 0x18);
  }
  else if (uVar4 == 0xfffffffffffffff4) {
    uVar2 = lj_tab_len((GCtab *)(uVar1 & 0x7fffffffffff));
  }
  else if (uVar4 == 0xfffffffffffffffb) {
    uVar2 = *(uint *)((uVar1 & 0x7fffffffffff) + 0x14);
  }
  else {
    uVar2 = 0;
    if (uVar4 < 0xfffffffffffffff3) {
      pGVar3 = lj_strfmt_number(L,o);
      o->u64 = (ulong)pGVar3 | 0xfffd800000000000;
      uVar2 = pGVar3->len;
    }
  }
  return (ulong)uVar2;
}

Assistant:

LUA_API size_t lua_objlen(lua_State *L, int idx)
{
  TValue *o = index2adr(L, idx);
  if (tvisstr(o)) {
    return strV(o)->len;
  } else if (tvistab(o)) {
    return (size_t)lj_tab_len(tabV(o));
  } else if (tvisudata(o)) {
    return udataV(o)->len;
  } else if (tvisnumber(o)) {
    GCstr *s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
    return s->len;
  } else {
    return 0;
  }
}